

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmInstructionType
anon_unknown.dwarf_12e14a::GetMirroredComparisonOperationWithLoad(VmInstructionType cmd)

{
  if (cmd - VM_INST_LESS < 4) {
    return *(VmInstructionType *)(&DAT_002043c0 + (ulong)(cmd - VM_INST_LESS) * 4);
  }
  __assert_fail("!\"unknown operation\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x121,
                "VmInstructionType (anonymous namespace)::GetMirroredComparisonOperationWithLoad(VmInstructionType)"
               );
}

Assistant:

VmInstructionType GetMirroredComparisonOperationWithLoad(VmInstructionType cmd)
	{
		switch(cmd)
		{
		case VM_INST_LESS:
			return VM_INST_GREATER_LOAD;
		case VM_INST_GREATER:
			return VM_INST_LESS_LOAD;
		case VM_INST_LESS_EQUAL:
			return VM_INST_GREATER_EQUAL_LOAD;
		case VM_INST_GREATER_EQUAL:
			return VM_INST_LESS_EQUAL_LOAD;
		default:
			break;
		}

		assert(!"unknown operation");
		return VM_INST_ABORT_NO_RETURN;
	}